

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_aCoupleOfTestFailures_Test::~TEST_JUnitOutputTest_aCoupleOfTestFailures_Test
          (TEST_JUnitOutputTest_aCoupleOfTestFailures_Test *this)

{
  TEST_JUnitOutputTest_aCoupleOfTestFailures_Test *this_local;
  
  ~TEST_JUnitOutputTest_aCoupleOfTestFailures_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, aCoupleOfTestFailures)
{
    testCaseRunner->start()
            .withGroup("testGroup")
                .withTest("passingOne")
                .withTest("FailingTest").thatFails("Failure", "file", 99)
                .withTest("passingTwo")
                .withTest("passingThree")
                .withTest("AnotherFailingTest").thatFails("otherFailure", "anotherFile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroup.xml");

    STRCMP_EQUAL("<failure message=\"file:99: Failure\" type=\"AssertionFailedError\">\n", outputFile->line(8));
    STRCMP_EQUAL("<failure message=\"anotherFile:10: otherFailure\" type=\"AssertionFailedError\">\n", outputFile->line(16));
}